

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void rtreeCheckCount(RtreeCheck *pCheck,char *zTbl,i64 nExpect)

{
  int iVar1;
  sqlite3_stmt *pStmt;
  Mem *pMem;
  i64 iVar2;
  
  if (pCheck->rc != 0) {
    return;
  }
  pStmt = rtreeCheckPrepare(pCheck,"SELECT count(*) FROM %Q.\'%q%s\'",pCheck->zDb,pCheck->zTab,zTbl)
  ;
  if (pStmt != (sqlite3_stmt *)0x0) {
    iVar1 = sqlite3_step(pStmt);
    if (iVar1 == 100) {
      pMem = columnMem(pStmt,0);
      iVar2 = sqlite3VdbeIntValue(pMem);
      columnMallocFailure(pStmt);
      if (iVar2 != nExpect) {
        rtreeCheckAppendMsg(pCheck,
                            "Wrong number of entries in %%%s table - expected %lld, actual %lld",
                            zTbl,nExpect,iVar2);
      }
    }
    iVar1 = sqlite3_finalize(pStmt);
    pCheck->rc = iVar1;
  }
  return;
}

Assistant:

static void rtreeCheckCount(RtreeCheck *pCheck, const char *zTbl, i64 nExpect){
  if( pCheck->rc==SQLITE_OK ){
    sqlite3_stmt *pCount;
    pCount = rtreeCheckPrepare(pCheck, "SELECT count(*) FROM %Q.'%q%s'",
        pCheck->zDb, pCheck->zTab, zTbl
    );
    if( pCount ){
      if( sqlite3_step(pCount)==SQLITE_ROW ){
        i64 nActual = sqlite3_column_int64(pCount, 0);
        if( nActual!=nExpect ){
          rtreeCheckAppendMsg(pCheck, "Wrong number of entries in %%%s table"
              " - expected %lld, actual %lld" , zTbl, nExpect, nActual
          );
        }
      }
      pCheck->rc = sqlite3_finalize(pCount);
    }
  }
}